

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_5x52_impl.h
# Opt level: O0

void secp256k1_fe_from_storage(secp256k1_fe *r,secp256k1_fe_storage *a)

{
  secp256k1_fe_storage *a_local;
  secp256k1_fe *r_local;
  
  r->n[0] = a->n[0] & 0xfffffffffffff;
  r->n[1] = a->n[0] >> 0x34 | (a->n[1] & 0xffffffffff) << 0xc;
  r->n[2] = a->n[1] >> 0x28 | (a->n[2] & 0xfffffff) << 0x18;
  r->n[3] = a->n[2] >> 0x1c | (a->n[3] & 0xffff) << 0x24;
  r->n[4] = a->n[3] >> 0x10;
  return;
}

Assistant:

static SECP256K1_INLINE void secp256k1_fe_from_storage(secp256k1_fe *r, const secp256k1_fe_storage *a) {
    r->n[0] = a->n[0] & 0xFFFFFFFFFFFFFULL;
    r->n[1] = a->n[0] >> 52 | ((a->n[1] << 12) & 0xFFFFFFFFFFFFFULL);
    r->n[2] = a->n[1] >> 40 | ((a->n[2] << 24) & 0xFFFFFFFFFFFFFULL);
    r->n[3] = a->n[2] >> 28 | ((a->n[3] << 36) & 0xFFFFFFFFFFFFFULL);
    r->n[4] = a->n[3] >> 16;
#ifdef VERIFY
    r->magnitude = 1;
    r->normalized = 1;
#endif
}